

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pSVar1;
  CClosure *pCVar2;
  CClosure *x_;
  TValue *io_1;
  TValue *io2;
  TValue *io1;
  CClosure *cl;
  int i;
  TValue *io;
  int n_local;
  lua_CFunction fn_local;
  lua_State *L_local;
  
  if (n == 0) {
    pSVar1 = (L->top).p;
    (pSVar1->val).value_.f = fn;
    (pSVar1->val).tt_ = '\x16';
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  else {
    pCVar2 = luaF_newCclosure(L,n);
    pCVar2->f = fn;
    for (cl._4_4_ = 0; cl._4_4_ < n; cl._4_4_ = cl._4_4_ + 1) {
      pSVar1 = (L->top).p;
      pCVar2->upvalue[cl._4_4_].value_ = pSVar1[(long)cl._4_4_ - (long)n].val.value_;
      (&pCVar2->upvalue[cl._4_4_].value_)[1].ub = pSVar1[(long)cl._4_4_ - (long)n].val.tt_;
    }
    (L->top).p = (L->top).p + -(long)n;
    pSVar1 = (L->top).p;
    *(CClosure **)pSVar1 = pCVar2;
    (pSVar1->val).tt_ = 'f';
    (L->top).p = (StkId)((L->top).offset + 0x10);
    if (L->l_G->GCdebt < 1) {
      luaC_step(L);
    }
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(s2v(L->top.p), fn);
    api_incr_top(L);
  }
  else {
    int i;
    CClosure *cl;
    api_checkpop(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    for (i = 0; i < n; i++) {
      setobj2n(L, &cl->upvalue[i], s2v(L->top.p - n + i));
      /* does not need barrier because closure is white */
      lua_assert(iswhite(cl));
    }
    L->top.p -= n;
    setclCvalue(L, s2v(L->top.p), cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}